

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

HostTexture * host_create_texture(Host *host,int w,int h,HostTextureFormat format)

{
  u32 uVar1;
  GLTextureFormat GVar2;
  ulong local_48;
  GLenum local_40;
  GLenum GStack_34;
  GLTextureFormat gl_format;
  GLuint handle;
  HostTexture *texture;
  HostTextureFormat format_local;
  int h_local;
  int w_local;
  Host *host_local;
  
  register0x00000000 = (HostTexture *)malloc(0x18);
  uVar1 = next_power_of_two(w);
  stack0xffffffffffffffd8->width = uVar1;
  uVar1 = next_power_of_two(h);
  stack0xffffffffffffffd8->height = uVar1;
  glGenTextures(1,&gl_format.format);
  glBindTexture(0xde1,gl_format.format);
  GVar2 = host_apply_texture_format(format);
  local_48 = GVar2._0_8_;
  local_40 = GVar2.type;
  gl_format.internal_format = local_40;
  GStack_34 = GVar2.format;
  glTexImage2D(0xde1,0,local_48 & 0xffffffff,stack0xffffffffffffffd8->width,
               stack0xffffffffffffffd8->height,0,GStack_34,local_40,0);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2801,0x2600);
  stack0xffffffffffffffd8->handle = (ulong)gl_format.format;
  stack0xffffffffffffffd8->format = format;
  return stack0xffffffffffffffd8;
}

Assistant:

HostTexture* host_create_texture(Host* host, int w, int h,
                                 HostTextureFormat format) {
  HostTexture* texture = xmalloc(sizeof(HostTexture));
  texture->width = next_power_of_two(w);
  texture->height = next_power_of_two(h);

  GLuint handle;
  glGenTextures(1, &handle);
  glBindTexture(GL_TEXTURE_2D, handle);
  GLTextureFormat gl_format = host_apply_texture_format(format);
  glTexImage2D(GL_TEXTURE_2D, 0, gl_format.internal_format, texture->width,
               texture->height, 0, gl_format.format, gl_format.type, NULL);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

  texture->handle = handle;
  texture->format = format;
  return texture;
}